

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void __thiscall ParseInt64_SignedAndUnsigned_Test::TestBody(ParseInt64_SignedAndUnsigned_Test *this)

{
  anon_unknown.dwarf_bcdf7::AssertInt64Equals
            (0x8000000000000000,"-9223372036854775808",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt64Equals(0xffffffffffffffff,"-1",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt64Equals(0xffffffffffffffff,"-0x1",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt64Equals(1,"+1",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt64Equals
            (0xf432105432105433,"-0x0BCDEFABCDEFABCD",SignedAndUnsigned);
  anon_unknown.dwarf_bcdf7::AssertInt64Equals
            (0xabcdefabcdefabcd,"+0xabcdefabcdefabcd",SignedAndUnsigned);
  return;
}

Assistant:

TEST(ParseInt64, SignedAndUnsigned) {
  AssertInt64Equals(9223372036854775808ull, "-9223372036854775808",
                    SignedAndUnsigned);
  AssertInt64Equals(18446744073709551615ull, "-1", SignedAndUnsigned);
  AssertInt64Equals(-1, "-0x1", SignedAndUnsigned);
  AssertInt64Equals(1, "+1", SignedAndUnsigned);
  AssertInt64Equals(-0x0bcdefabcdefabcdll, "-0x0BCDEFABCDEFABCD",
                    SignedAndUnsigned);
  AssertInt64Equals(0xabcdefabcdefabcdll, "+0xabcdefabcdefabcd",
                    SignedAndUnsigned);
}